

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyhashlin.c
# Opt level: O0

void tommy_hashlin_insert
               (tommy_hashlin *hashlin,tommy_hashlin_node *node,void *data,tommy_hash_t hash)

{
  long lVar1;
  tommy_hashlin_node **list;
  long in_FS_OFFSET;
  tommy_hash_t hash_local;
  void *data_local;
  tommy_hashlin_node *node_local;
  tommy_hashlin *hashlin_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  list = tommy_hashlin_bucket_ref(hashlin,hash);
  tommy_list_insert_tail(list,node,data);
  node->key = hash;
  hashlin->count = hashlin->count + 1;
  hashlin_grow_step(hashlin);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void tommy_hashlin_insert(tommy_hashlin* hashlin, tommy_hashlin_node* node, void* data, tommy_hash_t hash)
{
	tommy_list_insert_tail(tommy_hashlin_bucket_ref(hashlin, hash), node, data);

	node->key = hash;

	++hashlin->count;

	hashlin_grow_step(hashlin);
}